

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

int parse_http_header(http_t *info)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *p;
  http_t *info_local;
  
  fgets(info->buffer,0x2000,(FILE *)info->in);
  pcVar2 = strchr(info->buffer,0x20);
  if ((pcVar2 == (char *)0x0) || (pcVar3 = strcasestr(info->buffer,"HTTP"), pcVar3 == (char *)0x0))
  {
    if ((print_level & 4U) != 0) {
      printf("[%s][%s(%d)]:bad http head\n","MSG_ERROR","parse_http_header",0xf9);
    }
  }
  else {
    iVar1 = atoi(pcVar2 + 1);
    info->status_code = iVar1;
    if ((print_level & 1U) != 0) {
      printf("[%s][%s(%d)]:http status code: %d\n","MSG_DEBUG","parse_http_header",0xfd,
             (ulong)(uint)info->status_code);
    }
    while (pcVar2 = fgets(info->buffer,0x2000,(FILE *)info->in), pcVar2 != (char *)0x0) {
      iVar1 = strcmp(info->buffer,"\r\n");
      if (iVar1 == 0) {
        return 0;
      }
      if ((print_level & 1U) != 0) {
        printf("[%s][%s(%d)]:%s","MSG_DEBUG","parse_http_header",0x104,info->buffer);
      }
      pcVar2 = strncasestr(info->buffer,"Content-length");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strncasestr(info->buffer,"Transfer-Encoding");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strncasestr(info->buffer,"Location");
          if (pcVar2 != (char *)0x0) {
            pcVar2 = strchr(pcVar2,0x3a);
            strncpy(info->location,pcVar2 + 2,0x7ff);
            if ((print_level & 2U) != 0) {
              printf("[%s][%s(%d)]:Location: %s\n","MSG_INFO","parse_http_header",0x118,
                     info->location);
            }
          }
        }
        else {
          pcVar2 = strncasestr(info->buffer,"chunked");
          if (pcVar2 == (char *)0x0) {
            if ((print_level & 4U) != 0) {
              printf("[%s][%s(%d)]:Not support %s","MSG_ERROR","parse_http_header",0x110,
                     info->buffer);
            }
            return -1;
          }
          info->chunked_flag = 1;
          if ((print_level & 2U) != 0) {
            printf("[%s][%s(%d)]:%s","MSG_INFO","parse_http_header",0x113,info->buffer);
          }
        }
      }
      else {
        pcVar2 = strchr(pcVar2,0x3a);
        iVar1 = atoi(pcVar2 + 2);
        info->len = iVar1;
        if ((print_level & 2U) != 0) {
          printf("[%s][%s(%d)]:Content-length: %d\n","MSG_INFO","parse_http_header",0x10a,
                 (ulong)(uint)info->len);
        }
      }
    }
    if ((print_level & 4U) != 0) {
      printf("[%s][%s(%d)]:bad http/https head\n","MSG_ERROR","parse_http_header",0x11b);
    }
  }
  return -1;
}

Assistant:

int parse_http_header(http_t *info) {
  char *p = NULL;

  // resove first line
  fgets(info->buffer, RECV_BUF, info->in);
  p = strchr(info->buffer, ' ');
  // check http/https is legitimate
  if (!p || !strcasestr(info->buffer, "HTTP")) {
    lprintf(MSG_ERROR, "bad http head\n");
    return -1;
  }
  info->status_code = atoi(p + 1);
  lprintf(MSG_DEBUG, "http status code: %d\n", info->status_code);

  // Loop Read Resolve http Header
  while (fgets(info->buffer, RECV_BUF, info->in)) {
    // Judging whether the head has finished reading
    if (!strcmp(info->buffer, "\r\n")) return 0;

    lprintf(MSG_DEBUG, "%s", info->buffer);

    if ((p = strncasestr(info->buffer, (char *)"Content-length"))) {
      p = strchr(p, ':');
      p += 2;  // Skip the colon and the space behind it
      info->len = atoi(p);
      lprintf(MSG_INFO, "Content-length: %d\n", info->len);
    } else if ((p = strncasestr(info->buffer, (char *)"Transfer-Encoding"))) {
      if ((strncasestr(info->buffer, (char *)"chunked"))) {
        info->chunked_flag = 1;
      } else {
        // Unsupported Coding Transfer.
        lprintf(MSG_ERROR, "Not support %s", info->buffer);
        return -1;
      }
      lprintf(MSG_INFO, "%s", info->buffer);
    } else if ((p = strncasestr(info->buffer, (char *)"Location"))) {
      p = strchr(p, ':');
      p += 2;  // Skip the colon and the space behind it
      strncpy(info->location, p, URI_MAX_LEN - 1);
      lprintf(MSG_INFO, "Location: %s\n", info->location);
    }
  }
  lprintf(MSG_ERROR, "bad http/https head\n");
  return -1;
}